

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O3

uint64_t __thiscall leveldb::anon_unknown_2::FileState::Size(FileState *this)

{
  uint64_t uVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->blocks_mutex_);
  if (iVar2 == 0) {
    uVar1 = this->size_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->blocks_mutex_);
    return uVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

uint64_t Size() const {
    MutexLock lock(&blocks_mutex_);
    return size_;
  }